

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O2

void __thiscall NimState::do_move(NimState *this,Move move)

{
  if (move - 1U < 3) {
    check_invariant(this);
    this->chips = this->chips - move;
    this->player_to_move = 3 - this->player_to_move;
    check_invariant(this);
    return;
  }
  MCTS::assertion_failed
            ("move >= 1 && move <= 3",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/nim.h"
             ,0x17);
}

Assistant:

void do_move(Move move)
	{
		attest(move >= 1 && move <= 3);
		check_invariant();
	
		chips -= move;
		player_to_move = 3 - player_to_move;

		check_invariant();
	}